

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcXsim.c
# Opt level: O2

int Abc_XsimAnd(int Value0,int Value1)

{
  int iVar1;
  
  if (Value1 == 1 || Value0 == 1) {
    iVar1 = 1;
  }
  else if (Value1 == 3 || Value0 == 3) {
    iVar1 = 3;
  }
  else {
    if ((Value0 != 2) || (Value1 != 2)) {
      __assert_fail("Value0 == XVS1 && Value1 == XVS1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcXsim.c"
                    ,0x33,"int Abc_XsimAnd(int, int)");
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static inline int  Abc_XsimAnd( int Value0, int Value1 )   
{ 
    if ( Value0 == XVS0 || Value1 == XVS0 )
        return XVS0;
    if ( Value0 == XVSX || Value1 == XVSX )
        return XVSX;
    assert( Value0 == XVS1 && Value1 == XVS1 );
    return XVS1;
}